

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O0

void prof_appraise(CHAR_DATA *ch,char *argument)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  ROOM_INDEX_DATA *pRVar4;
  char *in_RSI;
  char *this;
  char_data *in_RDI;
  float fVar5;
  string buffer;
  float tcost;
  float mcost;
  OBJ_DATA *obj;
  undefined1 in_stack_00000110 [16];
  undefined1 in_stack_00000120 [16];
  CHAR_DATA *in_stack_000010b8;
  char *in_stack_000010c0;
  CHAR_DATA *in_stack_000010c8;
  void *in_stack_fffffffffffffea8;
  ROOM_INDEX_DATA *arg1;
  CHAR_DATA *in_stack_fffffffffffffeb8;
  CHAR_DATA *ch_00;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  undefined1 local_124 [12];
  NOTE_DATA *local_118;
  undefined1 local_110 [32];
  float local_f0;
  float local_ec;
  float local_e8;
  float local_e4;
  CHAR_DATA *local_e0;
  char_data *local_d0;
  undefined1 local_c8 [32];
  PC_DATA *local_a8;
  AFFECT_DATA *local_a0;
  DESCRIPTOR_DATA *local_90;
  AFFECT_DATA *local_88;
  NOTE_DATA *pNStack_80;
  CHAR_DATA *local_78;
  OBJ_DATA *local_70;
  ROOM_INDEX_DATA *local_68;
  char *local_60;
  ROOM_INDEX_DATA *local_58;
  PC_DATA *local_50;
  GEN_DATA *local_48;
  PC_DATA *local_40;
  PATHFIND_DATA *local_38;
  GEN_DATA *local_30;
  PC_DATA *local_28;
  AFFECT_DATA **local_20;
  AFFECT_DATA *local_18;
  OBJ_DATA *local_8;
  
  if ((*in_RSI != '\0') &&
     (local_d0 = in_RDI,
     local_e0 = (CHAR_DATA *)get_obj_carry(in_stack_000010c8,in_stack_000010c0,in_stack_000010b8),
     local_e0 != (CHAR_DATA *)0x0)) {
    char_data::Profs(local_d0);
    this = "appraising";
    iVar1 = CProficiencies::GetProf
                      ((CProficiencies *)
                       CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                       (char *)in_stack_fffffffffffffeb8);
    iVar2 = number_percent();
    local_e4 = (float)(((10 - iVar1) * iVar2) / 0x4b0);
    iVar1 = number_percent();
    if (iVar1 < 0x33) {
      local_ec = 0.0;
      local_f0 = -local_e4 * (float)*(int *)&local_e0->field_0x104 +
                 (float)*(int *)&local_e0->field_0x104;
      this = (char *)&local_f0;
      pfVar3 = std::max<float>(&local_ec,(float *)this);
      fVar5 = *pfVar3;
    }
    else {
      fVar5 = local_e4 * (float)*(int *)&local_e0->field_0x104 +
              (float)*(int *)&local_e0->field_0x104;
    }
    arg1 = (ROOM_INDEX_DATA *)(local_124 + 4);
    local_70 = (OBJ_DATA *)0x8357ea;
    local_60 = "You estimate the value of $p to be approximately {} gold.";
    local_124._4_8_ = "You estimate the value of $p to be approximately {} gold.";
    local_e8 = fVar5;
    local_68 = arg1;
    local_58 = arg1;
    pRVar4 = (ROOM_INDEX_DATA *)std::char_traits<char>::length((char_type *)0x7a8d05);
    arg1->next_room = pRVar4;
    local_8 = local_70;
    local_124._0_4_ = (undefined4)local_e8;
    ch_00 = (CHAR_DATA *)local_110;
    local_88 = (AFFECT_DATA *)local_124._4_8_;
    pNStack_80 = local_118;
    local_90 = (DESCRIPTOR_DATA *)local_124;
    local_20 = &local_88;
    local_a0 = (AFFECT_DATA *)local_124._4_8_;
    local_78 = ch_00;
    local_18 = local_a0;
    local_c8._0_8_ =
         fmt::v9::make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,int&>
                   ((format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_int> *
                    )local_90,(v9 *)this,(int *)ch_00);
    local_48 = (GEN_DATA *)(local_c8 + 0x18);
    local_50 = (PC_DATA *)local_c8;
    local_38 = (PATHFIND_DATA *)0x1;
    local_c8._24_8_ = (CHAR_DATA *)0x1;
    local_40 = local_50;
    local_30 = local_48;
    local_28 = local_50;
    local_a8 = local_50;
    fmt::v9::vformat_abi_cxx11_((string_view)in_stack_00000120,(format_args)in_stack_00000110);
    std::__cxx11::string::c_str();
    act((char *)CONCAT44(fVar5,in_stack_fffffffffffffec0),ch_00,arg1,in_stack_fffffffffffffea8,0);
    iVar1 = (int)((ulong)arg1 >> 0x20);
    char_data::Profs(local_d0);
    CProficiencies::CheckImprove
              ((CProficiencies *)CONCAT44(fVar5,in_stack_fffffffffffffec0),(char *)ch_00,iVar1);
    WAIT_STATE((CHAR_DATA *)CONCAT44(fVar5,in_stack_fffffffffffffec0),(int)((ulong)ch_00 >> 0x20));
    std::__cxx11::string::~string((string *)local_110);
    return;
  }
  send_to_char((char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
               in_stack_fffffffffffffeb8);
  return;
}

Assistant:

void prof_appraise(CHAR_DATA *ch, char *argument)
{
	OBJ_DATA *obj;
	if (argument[0] == '\0' || !(obj = get_obj_carry(ch, argument, ch)))
	{
		send_to_char("You aren't carrying that.\n\r", ch);
		return;
	}

	float mcost = (10 - ch->Profs()->GetProf("appraising")) * number_percent() / 1200;
	float tcost = number_percent() > 50
		? obj->cost + (mcost * obj->cost)
		: std::max((float)0, obj->cost - (mcost * obj->cost));

	auto buffer = fmt::format("You estimate the value of $p to be approximately {} gold.", (int)tcost);
	act(buffer.c_str(), ch, obj, 0, TO_CHAR);
	ch->Profs()->CheckImprove("appraising", 80);

	WAIT_STATE(ch, PULSE_VIOLENCE);
}